

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDocument.cpp
# Opt level: O2

BreakpointProbeList * __thiscall Js::DebugDocument::GetBreakpointList(DebugDocument *this)

{
  ScriptContext *this_00;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BreakpointProbeList *pBVar4;
  ArenaAllocator *alloc;
  undefined4 *puVar5;
  List<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar6;
  
  pBVar4 = this->m_breakpointList;
  if (pBVar4 == (BreakpointProbeList *)0x0) {
    this_00 = (this->utf8SourceInfo->m_scriptContext).ptr;
    if ((this_00 != (ScriptContext *)0x0) &&
       (iVar3 = (*(this_00->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(this_00),
       (char)iVar3 == '\0')) {
      alloc = ScriptContext::AllocatorForDiagnostics(this_00);
      if (alloc == (ArenaAllocator *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugDocument.cpp"
                                    ,0x3a,"(diagnosticArena)","diagnosticArena");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      pLVar6 = JsUtil::
               List<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::New(alloc,4);
      this->m_breakpointList = pLVar6;
      return pLVar6;
    }
    pBVar4 = (BreakpointProbeList *)0x0;
  }
  return pBVar4;
}

Assistant:

BreakpointProbeList* DebugDocument::GetBreakpointList()
    {
        if (m_breakpointList != nullptr)
        {
            return m_breakpointList;
        }

        ScriptContext * scriptContext = this->utf8SourceInfo->GetScriptContext();
        if (scriptContext == nullptr || scriptContext->IsClosed())
        {
            return nullptr;
        }

        ArenaAllocator* diagnosticArena = scriptContext->AllocatorForDiagnostics();
        Assert(diagnosticArena);

        m_breakpointList = this->NewBreakpointList(diagnosticArena);
        return m_breakpointList;
    }